

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

bool S2::ApproximatelyOrdered(S2Point *a,S2Point *x,S2Point *b,double tolerance)

{
  bool bVar1;
  double dVar2;
  D local_68;
  BasicVector<Vector3,_double,_3UL> local_48 [24];
  
  local_68.c_[2] = x->c_[2] - a->c_[2];
  local_68.c_[0] = x->c_[0] - a->c_[0];
  local_68.c_[1] = x->c_[1] - a->c_[1];
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_68);
  bVar1 = true;
  if (tolerance * tolerance < dVar2) {
    local_68.c_[2] = x->c_[2] - b->c_[2];
    local_68.c_[0] = x->c_[0] - b->c_[0];
    local_68.c_[1] = x->c_[1] - b->c_[1];
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                      ((BasicVector<Vector3,_double,_3UL> *)&local_68);
    if (tolerance * tolerance < dVar2) {
      RobustCrossProd((Vector3_d *)local_48,a,b);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize(&local_68,local_48);
      bVar1 = s2pred::OrderedCCW(a,x,b,&local_68);
    }
  }
  return bVar1;
}

Assistant:

static bool ApproximatelyOrdered(const S2Point& a, const S2Point& x,
                                 const S2Point& b, double tolerance) {
  if ((x - a).Norm2() <= tolerance * tolerance) return true;
  if ((x - b).Norm2() <= tolerance * tolerance) return true;
  return s2pred::OrderedCCW(a, x, b, S2::RobustCrossProd(a, b).Normalize());
}